

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O1

void __thiscall tcu::Matrix<tcu::Interval,_4,_2>::Matrix(Matrix<tcu::Interval,_4,_2> *this)

{
  double *pdVar1;
  long lVar2;
  Vector<tcu::Interval,_4> *pVVar3;
  long lVar4;
  undefined8 *puVar5;
  long lVar6;
  bool bVar7;
  uint uVar8;
  undefined1 auStack_70 [8];
  undefined8 auStack_68 [13];
  
  lVar2 = 0;
  pVVar3 = (Vector<tcu::Interval,_4> *)this;
  do {
    lVar4 = 0x10;
    do {
      *(undefined1 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_4>,_2> *)pVVar3->m_data)->m_data[0].m_data +
       lVar4 + -0x10) = 0;
      *(undefined8 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_4>,_2> *)pVVar3->m_data)->m_data[0].m_data +
       lVar4 + -8) = 0x7ff0000000000000;
      *(undefined8 *)
       (&((Vector<tcu::Vector<tcu::Interval,_4>,_2> *)pVVar3->m_data)->m_data[0].m_data[0].m_hasNaN
       + lVar4) = 0xfff0000000000000;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x70);
    lVar4 = 0x10;
    do {
      *(undefined1 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_4>,_2> *)pVVar3->m_data)->m_data[0].m_data +
       lVar4 + -0x10) = 0;
      *(undefined8 *)
       ((long)((Vector<tcu::Vector<tcu::Interval,_4>,_2> *)pVVar3->m_data)->m_data[0].m_data +
       lVar4 + -8) = 0x7ff0000000000000;
      *(undefined8 *)
       (&((Vector<tcu::Vector<tcu::Interval,_4>,_2> *)pVVar3->m_data)->m_data[0].m_data[0].m_hasNaN
       + lVar4) = 0xfff0000000000000;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x70);
    lVar2 = lVar2 + 0x60;
    pVVar3 = pVVar3 + 1;
  } while (lVar2 != 0xc0);
  lVar2 = 0;
  do {
    lVar4 = 0x10;
    do {
      auStack_70[lVar4] = 0;
      *(undefined8 *)((long)auStack_68 + lVar4) = 0x7ff0000000000000;
      *(undefined8 *)((long)auStack_68 + lVar4 + 8) = 0xfff0000000000000;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x70);
    lVar4 = 0x10;
    do {
      auStack_70[lVar4] = 0;
      *(undefined8 *)((long)auStack_68 + lVar4) = 0x7ff0000000000000;
      *(undefined8 *)((long)auStack_68 + lVar4 + 8) = 0xfff0000000000000;
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x70);
    pVVar3 = (this->m_data).m_data + lVar2;
    puVar5 = auStack_68;
    for (lVar4 = 0xc; puVar5 = puVar5 + 1, lVar4 != 0; lVar4 = lVar4 + -1) {
      *(undefined8 *)pVVar3->m_data = *puVar5;
      pVVar3 = (Vector<tcu::Interval,_4> *)&pVVar3->m_data[0].m_lo;
    }
    bVar7 = lVar2 == 0;
    lVar2 = lVar2 + 1;
  } while (bVar7);
  pdVar1 = &(this->m_data).m_data[0].m_data[0].m_hi;
  lVar2 = 0;
  lVar4 = 0;
  do {
    lVar6 = 0;
    do {
      uVar8 = 0x3ff00000;
      if (lVar2 != lVar6) {
        uVar8 = 0;
      }
      *(undefined1 *)((long)pdVar1 + lVar6 + -0x10) = 0;
      *(ulong *)((long)pdVar1 + lVar6 + -8) = (ulong)uVar8 << 0x20;
      *(ulong *)((long)pdVar1 + lVar6) = (ulong)uVar8 << 0x20;
      lVar6 = lVar6 + 0x60;
    } while (lVar6 == 0x60);
    lVar4 = lVar4 + 1;
    lVar2 = lVar2 + 0x60;
    pdVar1 = pdVar1 + 3;
  } while (lVar4 != 4);
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (void)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = (row == col) ? T(1) : T(0);
}